

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CriticalSectionsBuilder.cpp
# Opt level: O0

set<const_llvm::CallInst_*,_std::less<const_llvm::CallInst_*>,_std::allocator<const_llvm::CallInst_*>_>
* __thiscall
CriticalSectionsBuilder::correspondingUnlocks(CriticalSectionsBuilder *this,CallInst *lock)

{
  bool bVar1;
  long in_RDX;
  set<const_llvm::CallInst_*,_std::less<const_llvm::CallInst_*>,_std::allocator<const_llvm::CallInst_*>_>
  *in_RDI;
  const_iterator iterator;
  map<const_llvm::CallInst_*,_CriticalSection_*,_std::less<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_CriticalSection_*>_>_>
  *in_stack_ffffffffffffffb8;
  _Self local_28;
  _Self local_20 [4];
  
  if (in_RDX == 0) {
    memset(in_RDI,0,0x30);
    std::
    set<const_llvm::CallInst_*,_std::less<const_llvm::CallInst_*>,_std::allocator<const_llvm::CallInst_*>_>
    ::set((set<const_llvm::CallInst_*,_std::less<const_llvm::CallInst_*>,_std::allocator<const_llvm::CallInst_*>_>
           *)0x1af58d);
  }
  else {
    local_20[0]._M_node =
         (_Base_ptr)
         std::
         map<const_llvm::CallInst_*,_CriticalSection_*,_std::less<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_CriticalSection_*>_>_>
         ::find(in_stack_ffffffffffffffb8,(key_type *)0x1af5a5);
    local_28._M_node =
         (_Base_ptr)
         std::
         map<const_llvm::CallInst_*,_CriticalSection_*,_std::less<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_CriticalSection_*>_>_>
         ::end(in_stack_ffffffffffffffb8);
    bVar1 = std::operator!=(local_20,&local_28);
    if (bVar1) {
      std::_Rb_tree_const_iterator<std::pair<const_llvm::CallInst_*const,_CriticalSection_*>_>::
      operator->((_Rb_tree_const_iterator<std::pair<const_llvm::CallInst_*const,_CriticalSection_*>_>
                  *)0x1af5df);
      CriticalSection::unlocks((CriticalSection *)this);
    }
    else {
      memset(in_RDI,0,0x30);
      std::
      set<const_llvm::CallInst_*,_std::less<const_llvm::CallInst_*>,_std::allocator<const_llvm::CallInst_*>_>
      ::set((set<const_llvm::CallInst_*,_std::less<const_llvm::CallInst_*>,_std::allocator<const_llvm::CallInst_*>_>
             *)0x1af60a);
    }
  }
  return in_RDI;
}

Assistant:

std::set<const llvm::CallInst *> CriticalSectionsBuilder::correspondingUnlocks(
        const llvm::CallInst *lock) const {
    if (!lock) {
        return {};
    }
    auto iterator = criticalSections_.find(lock);
    if (iterator != criticalSections_.end()) {
        return iterator->second->unlocks();
    }
    return {};
}